

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/3rdparty/catch.hpp:9738:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_alecthomas[P]entityx_entityx_3rdparty_catch_hpp:9738:35)>
          *this,string *arg)

{
  long lVar1;
  size_type __n;
  int iVar2;
  InWhatOrder IVar3;
  long *plVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  long *local_c0;
  long local_b0;
  uint uStack_a8;
  undefined4 uStack_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_a0);
  __n = local_a0._M_string_length;
  local_78 = 0;
  local_80 = &PTR__BasicResult_001c0898;
  local_68 = 0;
  local_60[0] = 0;
  local_b0 = 0x646572616c636564;
  uStack_a8 = uStack_a8 & 0xffffff00;
  local_70 = local_60;
  if ((local_a0._M_string_length < 9) &&
     ((local_a0._M_string_length == 0 ||
      (iVar2 = bcmp(local_a0._M_dataplus._M_p,&local_b0,local_a0._M_string_length), iVar2 == 0)))) {
    IVar3 = InDeclarationOrder;
  }
  else {
    local_b0 = 0x6c61636978656c;
    if ((__n < 8) &&
       ((__n == 0 || (iVar2 = bcmp(local_a0._M_dataplus._M_p,&local_b0,__n), iVar2 == 0)))) {
      IVar3 = InLexicographicalOrder;
    }
    else {
      local_b0 = CONCAT17(local_b0._7_1_,0x6d6f646e6172);
      if (6 < __n) {
LAB_00174a41:
        ::std::operator+(&local_50,"Unrecognised ordering: \'",&local_a0);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_50);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_b0 = *plVar5;
          uStack_a8 = *(uint *)(plVar4 + 3);
          uStack_a4 = *(undefined4 *)((long)plVar4 + 0x1c);
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar5;
          local_c0 = (long *)*plVar4;
        }
        lVar1 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
        super_ResultBase.m_type = RuntimeError;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c0898;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_errorMessage,local_c0,lVar1 + (long)local_c0
                  );
        if (local_c0 != &local_b0) {
          operator_delete(local_c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        goto LAB_00174b2c;
      }
      if (__n == 0) {
        IVar3 = InRandomOrder;
      }
      else {
        iVar2 = bcmp(local_a0._M_dataplus._M_p,&local_b0,__n);
        if (iVar2 != 0) goto LAB_00174a41;
        IVar3 = InRandomOrder;
      }
    }
  }
  ((this->m_lambda).config)->runOrder = IVar3;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001c0898;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00174b2c:
  local_80 = &PTR__BasicResult_001c0898;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }